

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_fruit.cpp
# Opt level: O0

void use_fruit(void)

{
  undefined1 local_48 [8];
  Banana c;
  undefined1 local_20 [8];
  Banana b;
  
  L13_4::Banana::Banana((Banana *)local_20,"b0","b0-class");
  L13_4::operator<<((ostream *)&std::cout,(Banana *)local_20);
  L13_4::operator<<((ostream *)&std::cout,(Fruit *)local_20);
  L13_4::Banana::Banana((Banana *)local_48,"C0","C0-class");
  L13_4::operator<<((ostream *)&std::cout,(Banana *)local_48);
  L13_4::Banana::operator=((Banana *)local_48,(Banana *)local_20);
  L13_4::operator<<((ostream *)&std::cout,(Banana *)local_48);
  L13_4::Banana::~Banana((Banana *)local_48);
  L13_4::Banana::~Banana((Banana *)local_20);
  return;
}

Assistant:

void use_fruit() {
    //
    using namespace L13_4;
    using std::cout;
    using std::endl;

    Banana b("b0", "b0-class");
    //  默认是调用衍生类的友元重载运算符方法
    cout << b;

    //  只调用其基类的友元重载运算符方法
    cout << (const Fruit &)b;

    Banana c("C0", "C0-class");

    cout << c;

    c = b;

    cout << c;
}